

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

uint32_t ssl_get_hs_frag_off(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  
  puVar1 = ssl->in_msg;
  return (uint)puVar1[8] | (uint)puVar1[7] << 8 | (uint)puVar1[6] << 0x10;
}

Assistant:

static uint32_t ssl_get_hs_frag_off(mbedtls_ssl_context const *ssl)
{
    return (ssl->in_msg[6] << 16) |
           (ssl->in_msg[7] << 8) |
           ssl->in_msg[8];
}